

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_color(nk_context *ctx,nk_color color,nk_vec2 size)

{
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect header_00;
  nk_rect r_00;
  nk_vec2 size_00;
  nk_widget_layout_states nVar1;
  int iVar2;
  nk_color in_ESI;
  long in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float type;
  float is_clicked_00;
  float fVar10;
  nk_symbol_type sym;
  nk_rect bounds;
  nk_rect button;
  nk_rect content;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_context *in_stack_fffffffffffffee0;
  float rounding;
  nk_command_buffer *in_stack_fffffffffffffee8;
  nk_color in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  nk_style_button *style_00;
  nk_flags in_stack_ffffffffffffff0c;
  undefined4 uVar11;
  float fVar12;
  nk_button_behavior in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  float fVar13;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  int *local_50;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  int local_4;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x3fc8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) == 0)) {
    local_4 = 0;
  }
  else {
    nVar1 = nk_widget((nk_rect *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    if (nVar1 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      r_00.y = (float)in_stack_ffffffffffffff38;
      r_00.x = (float)in_stack_ffffffffffffff34;
      r_00.w = (float)in_stack_ffffffffffffff3c;
      r_00.h = in_stack_ffffffffffffff40;
      iVar2 = nk_button_behavior((nk_flags *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),r_00,
                                 (nk_input *)
                                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                 in_stack_ffffffffffffff1c);
      if ((*(uint *)(in_RDI + 0x1f50) & 0x20) == 0) {
        if ((*(uint *)(in_RDI + 0x1f50) & 0x10) == 0) {
          local_50 = (int *)(in_RDI + 0x1a98);
        }
        else {
          local_50 = (int *)(in_RDI + 0x1ab8);
        }
      }
      else {
        local_50 = (int *)(in_RDI + 0x1ad8);
      }
      if (*local_50 == 1) {
        r.y = (float)in_stack_fffffffffffffefc;
        r.x = (float)in_stack_fffffffffffffef8;
        r.w = (float)(int)in_stack_ffffffffffffff00;
        r.h = (float)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        nk_draw_image(in_stack_fffffffffffffee8,r,(nk_image *)in_stack_fffffffffffffee0,
                      in_stack_fffffffffffffef4);
        rounding = (float)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      }
      else {
        rect.y = (float)in_stack_fffffffffffffefc;
        rect.x = (float)in_stack_fffffffffffffef8;
        rect.w = (float)(int)in_stack_ffffffffffffff00;
        rect.h = (float)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        nk_fill_rect(in_stack_fffffffffffffee8,rect,
                     (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffef4);
        rect_00.y = (float)in_stack_fffffffffffffefc;
        rect_00.x = (float)in_stack_fffffffffffffef8;
        rect_00.w = (float)(int)in_stack_ffffffffffffff00;
        rect_00.h = (float)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        nk_stroke_rect(in_stack_fffffffffffffee8,rect_00,
                       (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                       SUB84(in_stack_fffffffffffffee0,0),in_stack_fffffffffffffef4);
        rounding = (float)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      }
      if ((*(uint *)(in_RDI + 0x1f50) & 0x10) == 0) {
        if (iVar2 == 0) {
          uVar11 = *(undefined4 *)(in_RDI + 0x1bc8);
        }
        else {
          uVar11 = *(undefined4 *)(in_RDI + 0x1bd0);
        }
      }
      else {
        uVar11 = *(undefined4 *)(in_RDI + 0x1bcc);
      }
      fVar3 = fStack_34 - (*(float *)(in_RDI + 0x1be8) + *(float *)(in_RDI + 0x1be8));
      fVar4 = ((local_40 + fStack_38) - fStack_34) - *(float *)(in_RDI + 0x1be4);
      fVar5 = fVar4 + *(float *)(in_RDI + 0x1b98);
      fVar6 = fStack_3c + *(float *)(in_RDI + 0x1be8) + *(float *)(in_RDI + 0x1b9c);
      fVar7 = fVar3 - (*(float *)(in_RDI + 0x1b98) + *(float *)(in_RDI + 0x1b98));
      fVar8 = fVar3 - (*(float *)(in_RDI + 0x1b9c) + *(float *)(in_RDI + 0x1b9c));
      fVar9 = *(float *)(in_RDI + 0x1be0) * -4.0 + fStack_34;
      type = *(float *)(in_RDI + 0x1be0) + *(float *)(in_RDI + 0x1be0) + fStack_3c;
      is_clicked_00 = *(float *)(in_RDI + 0x1bdc) + *(float *)(in_RDI + 0x1bdc) + local_40;
      fVar10 = (fVar4 - (*(float *)(in_RDI + 0x1bdc) + *(float *)(in_RDI + 0x1bec))) - is_clicked_00
      ;
      style_00 = (nk_style_button *)CONCAT44(fVar9,fVar10);
      rect_01.y = type;
      rect_01.x = is_clicked_00;
      rect_01._8_8_ = style_00;
      fVar12 = type;
      fVar13 = fVar3;
      nk_fill_rect(in_stack_fffffffffffffee8,rect_01,rounding,in_ESI);
      nk_draw_button_symbol
                ((nk_command_buffer *)CONCAT44(fVar4,fVar9),(nk_rect *)CONCAT44(fVar10,fVar12),
                 (nk_rect *)CONCAT44(is_clicked_00,uVar11),in_stack_ffffffffffffff0c,style_00,
                 (nk_symbol_type)type,(nk_user_font *)CONCAT44(fVar5,fVar13));
      size_00.y = fVar8;
      size_00.x = fVar7;
      header_00.y = fVar13;
      header_00.x = fVar3;
      header_00.w = fVar5;
      header_00.h = fVar6;
      local_4 = nk_combo_begin((nk_context *)CONCAT44(fVar4,fVar9),
                               (nk_window *)CONCAT44(fVar10,fVar12),size_00,(int)is_clicked_00,
                               header_00);
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo_begin_color(struct nk_context *ctx, struct nk_color color, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED)
        background = &style->combo.active;
    else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        background = &style->combo.hover;
    else background = &style->combo.normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, header, &background->data.image,nk_white);
    } else {
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect bounds;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw color */
        bounds.h = header.h - 4 * style->combo.content_padding.y;
        bounds.y = header.y + 2 * style->combo.content_padding.y;
        bounds.x = header.x + 2 * style->combo.content_padding.x;
        bounds.w = (button.x - (style->combo.content_padding.x + style->combo.spacing.x)) - bounds.x;
        nk_fill_rect(&win->buffer, bounds, 0, color);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}